

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O2

bool __thiscall
ON_FileIterator::Initialize(ON_FileIterator *this,wchar_t *directory_name,wchar_t *item_name_filter)

{
  bool bVar1;
  int iVar2;
  ON_wString local_directory_name;
  ON_wString local_item_name_filter;
  ON_wString local_30;
  ON_wString local_28;
  
  ON_wString::ON_wString(&local_28,item_name_filter);
  ON_wString::operator_cast_to_wchar_t_(&local_28);
  ON_wString::ON_wString(&local_30,directory_name);
  ON_wString::TrimRight(&local_30,L"/\\");
  iVar2 = ON_wString::Length(&local_30);
  if (0 < iVar2) {
    bVar1 = ON_wString::IsEmpty(&local_30);
    if (!bVar1) goto LAB_004906a3;
  }
  ON_wString::operator=(&local_30,directory_name);
LAB_004906a3:
  Reset(this);
  ON_wString::operator=((ON_wString *)(this + 8),&local_30);
  ON_wString::operator=((ON_wString *)(this + 0x10),&local_28);
  bVar1 = ON_wString::IsEmpty((ON_wString *)(this + 8));
  if (!bVar1) {
    *(undefined4 *)this = 1;
  }
  ON_wString::~ON_wString(&local_30);
  ON_wString::~ON_wString(&local_28);
  return !bVar1;
}

Assistant:

bool ON_FileIterator::Initialize( 
  const wchar_t* directory_name, 
  const wchar_t* item_name_filter
  )
{
  const ON_wString local_item_name_filter(item_name_filter);
  item_name_filter = local_item_name_filter;

  ON_wString local_directory_name(directory_name);
  {
    const wchar_t* dir_seps = L"/\\";
    local_directory_name.TrimRight(dir_seps);
    if ( local_directory_name.Length() <= 0 || local_directory_name.IsEmpty() )
      local_directory_name = directory_name;
  }

  Reset();
  m_directory = local_directory_name;
  m_item_name_filter = local_item_name_filter;
  if (m_directory.IsEmpty())
    return false;
  m_state = 1;
  return true;
}